

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * useStyledStreamWriter_abi_cxx11_(string *__return_storage_ptr__,Value *root)

{
  size_t in_RCX;
  StyledStreamWriter writer;
  ostringstream sout;
  string local_228;
  StyledStreamWriter local_208;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"\t","");
  Json::StyledStreamWriter::StyledStreamWriter(&local_208,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  Json::StyledStreamWriter::write(&local_208,(int)local_198,root,in_RCX);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  Json::StyledStreamWriter::~StyledStreamWriter(&local_208);
  return __return_storage_ptr__;
}

Assistant:

static std::string useStyledStreamWriter(
    Json::Value const& root)
{
  Json::StyledStreamWriter writer;
  std::ostringstream sout;
  writer.write(sout, root);
  return sout.str();
}